

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.cxx
# Opt level: O0

bool operator==(cmLinkItem *l,cmLinkItem *r)

{
  __type _Var1;
  bool local_19;
  cmLinkItem *r_local;
  cmLinkItem *l_local;
  
  local_19 = false;
  if (l->Target == r->Target) {
    _Var1 = std::operator==(&l->String,&r->String);
    local_19 = false;
    if (_Var1) {
      local_19 = (l->Cross & 1U) == (r->Cross & 1U);
    }
  }
  return local_19;
}

Assistant:

bool operator==(cmLinkItem const& l, cmLinkItem const& r)
{
  return l.Target == r.Target && l.String == r.String && l.Cross == r.Cross;
}